

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

uint uv__kernel_version(void)

{
  int iVar1;
  uint uVar2;
  uint patch;
  uint minor;
  uint major;
  utsname u;
  int local_19c;
  int local_198;
  int local_194;
  utsname local_18e;
  
  uVar2 = uv__kernel_version::cached_version;
  if (uv__kernel_version::cached_version == 0) {
    iVar1 = uname(&local_18e);
    if (iVar1 == -1) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      iVar1 = sscanf(local_18e.release,"%u.%u.%u",&local_194,&local_198,&local_19c);
      if (iVar1 == 3) {
        uVar2 = local_198 * 0x100 + local_194 * 0x10000 + local_19c;
        uv__kernel_version::cached_version = uVar2;
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned uv__kernel_version(void) {
  static _Atomic unsigned cached_version;
  struct utsname u;
  unsigned version;
  unsigned major;
  unsigned minor;
  unsigned patch;

  version = atomic_load_explicit(&cached_version, memory_order_relaxed);
  if (version != 0)
    return version;

  if (-1 == uname(&u))
    return 0;

  if (3 != sscanf(u.release, "%u.%u.%u", &major, &minor, &patch))
    return 0;

  version = major * 65536 + minor * 256 + patch;
  atomic_store_explicit(&cached_version, version, memory_order_relaxed);

  return version;
}